

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O2

obj * tt_oname(obj *otmp)

{
  char cVar1;
  char **ppcVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  toptenentry *__ptr;
  obj *body;
  short sVar6;
  char **ppcVar7;
  ulong uVar8;
  
  if (otmp == (obj *)0x0) {
    body = (obj *)0x0;
  }
  else {
    iVar4 = open_datafile("record",0,2);
    uVar8 = 100;
    __ptr = read_topten(iVar4,100);
    close(iVar4);
    do {
      uVar5 = mt_random();
      uVar8 = (ulong)uVar5 % uVar8;
      if (0 < __ptr[uVar8].points) goto LAB_0024e267;
    } while (((int)uVar8 != 0) && (__ptr[uVar8].deathlev == 0));
    if (__ptr[uVar8].deathlev == 0) {
      body = (obj *)0x0;
    }
    else {
LAB_0024e267:
      if (otmp->otyp == 0x10e) {
        obj_stop_timers(otmp);
      }
      cVar1 = __ptr[uVar8].plgend[0];
      ppcVar2 = bottlenames + 5;
      do {
        ppcVar7 = ppcVar2;
        if (ppcVar7[9] == (char *)0x0) {
          warning("What weird role is this? (%s)",__ptr[uVar8].plrole);
          iVar4 = 0xc6;
          goto LAB_0024e2f6;
        }
        iVar4 = strncmp(__ptr[uVar8].plrole,ppcVar7[0x20],3);
        ppcVar2 = ppcVar7 + 0x23;
      } while (iVar4 != 0);
      if ((cVar1 != 'F') || (iVar4 = (int)*(short *)((long)ppcVar7 + 0x11a), iVar4 == -1)) {
        sVar3 = (short)*(undefined4 *)(ppcVar7 + 0x23);
        sVar6 = 0x10b;
        if (sVar3 != -1) {
          sVar6 = sVar3;
        }
        iVar4 = (int)sVar6;
      }
LAB_0024e2f6:
      otmp->corpsenm = iVar4;
      uVar5 = weight(otmp);
      otmp->owt = uVar5;
      body = oname(otmp,__ptr[uVar8].name);
      if (body->otyp == 0x10e) {
        start_corpse_timeout(body);
      }
    }
    free(__ptr);
  }
  return body;
}

Assistant:

struct obj *tt_oname(struct obj *otmp)
{
    int rank, fd;
    struct toptenentry *toptenlist, *tt;

    if (!otmp)
	return NULL;

    fd = open_datafile(RECORD, O_RDONLY, SCOREPREFIX);
    toptenlist = read_topten(fd, 100); /* load the top 100 scores */
    close(fd);
    
    /* try to find a valid entry, reducing the value range for rank each time */
    rank = rn2(100);
    while (!validentry(toptenlist[rank]) && rank)
	rank = rn2(rank);
    
    tt = &toptenlist[rank];
    
    if (!validentry(toptenlist[rank]))
	otmp = NULL; /* the topten list is empty */
    else {
	/* reset timer in case corpse started out as lizard or troll */
	if (otmp->otyp == CORPSE)
	    obj_stop_timers(otmp);
	otmp->corpsenm = classmon(tt->plrole, (tt->plgend[0] == 'F'));
	otmp->owt = weight(otmp);
	otmp = oname(otmp, tt->name);
	if (otmp->otyp == CORPSE)
	    start_corpse_timeout(otmp);
    }
    
    free(toptenlist);
    return otmp;
}